

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86_fma::create_pipeline(Convolution_x86_fma *this,Option *opt)

{
  bool bVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  Allocator *pAVar5;
  void *pvVar6;
  bool bVar7;
  ulong uVar8;
  undefined3 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  Layer *pLVar13;
  int iVar14;
  long lVar15;
  int inch;
  byte bVar16;
  uint kernel_w;
  int iVar17;
  uint uVar18;
  Option *pOVar19;
  uint kernel_h;
  int iVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar23 [16];
  undefined1 auStackY_118 [12];
  undefined1 auStackY_10c [12];
  undefined8 uStackY_100;
  undefined8 uStack_f0;
  undefined1 auStack_ec [4];
  ParamDict pd_5;
  ParamDict pd;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  undefined8 uStack_a8;
  int aiStack_a0 [2];
  size_t local_98;
  void *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  long *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_40;
  
  p_Var2 = this->_vptr_Convolution_x86_fma[-3];
  if (*(int *)(p_Var2 + 0x28 + (long)&(this->weight_winograd63_data).data) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(p_Var2 + 0x24 + (long)&(this->weight_winograd43_data).data)) {
  case 1:
    uStack_f0 = 0x20f978;
    pLVar13 = create_layer(0x1a);
    uStack_f0 = 0x20f988;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20f994;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 2:
    uStack_f0 = 0x20fa58;
    pLVar13 = create_layer(0x1a);
    uStack_f0 = 0x20fa68;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20fa7e;
    ParamDict::set(&pd,0,**(float **)(p_Var2 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x20fa8c;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 3:
    uStack_f0 = 0x20f9ce;
    pLVar13 = create_layer(0x36);
    uStack_f0 = 0x20f9de;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20f9f4;
    ParamDict::set(&pd,0,**(float **)(p_Var2 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x20fa10;
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var2 + 0x28 +
                                             (long)&(this->weight_winograd43_data).data) + 4));
    uStack_f0 = 0x20fa1e;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 4:
    uStack_f0 = 0x20fa2d;
    pLVar13 = create_layer(0x1e);
    uStack_f0 = 0x20fa3d;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20fa49;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 5:
    uStack_f0 = 0x20f9a3;
    pLVar13 = create_layer(0x47);
    uStack_f0 = 0x20f9b3;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20f9bf;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 6:
    uStack_f0 = 0x20fa98;
    pLVar13 = create_layer(0x43);
    uStack_f0 = 0x20faa8;
    ParamDict::ParamDict(&pd);
    uStack_f0 = 0x20fabe;
    ParamDict::set(&pd,0,**(float **)(p_Var2 + 0x28 + (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x20fada;
    ParamDict::set(&pd,1,*(float *)(*(long *)(p_Var2 + 0x28 +
                                             (long)&(this->weight_winograd43_data).data) + 4));
    uStack_f0 = 0x20fae8;
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  default:
    pLVar13 = (Layer *)0x0;
    goto LAB_0020faf2;
  }
  uStack_f0 = 0x20faf2;
  ParamDict::~ParamDict(&pd);
LAB_0020faf2:
  if (pLVar13 != (Layer *)0x0) {
    uStack_f0 = 0x20fb03;
    (*pLVar13->_vptr_Layer[4])(pLVar13,opt);
  }
  this->activation = pLVar13;
  if ((opt->use_int8_inference == true) &&
     (*(long *)(this->_vptr_Convolution_x86_fma[-3] + 0x40 +
               (long)&(this->weight_winograd63_data).data) == 1)) {
    uStack_f0 = 0x20fb2b;
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  p_Var2 = this->_vptr_Convolution_x86_fma[-3];
  uVar18 = *(uint *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
  kernel_w = *(uint *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
  kernel_h = *(uint *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar8 = (long)*(int *)(p_Var2 + 0x1c + (long)&(this->weight_winograd43_data).data) /
          (long)(int)(kernel_h * kernel_w);
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)(int)uVar18
  ;
  if ((((kernel_w == kernel_h && opt->use_packing_layout == false) &&
       (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) &&
      (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) ==
       *(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data))) &&
     ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
      (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) {
    uStack_f0 = 0x20fbb9;
    pLVar13 = create_layer(6);
    this->convolution_dilation1 = pLVar13;
    uStack_f0 = 0x20fbcb;
    ParamDict::ParamDict(&pd_5);
    uStack_f0 = 0x20fbe3;
    ParamDict::set(&pd_5,0,*(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x30 +
                                   (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x20fbfe;
    ParamDict::set(&pd_5,1,*(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x34 +
                                   (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x20fc19;
    ParamDict::set(&pd_5,0xb,
                   *(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x38 +
                           (long)&(this->weight_winograd23_data).data));
    uStack_f0 = 0x20fc2b;
    ParamDict::set(&pd_5,2,1);
    uStack_f0 = 0x20fc3d;
    ParamDict::set(&pd_5,0xc,1);
    uStack_f0 = 0x20fc4f;
    ParamDict::set(&pd_5,3,1);
    uStack_f0 = 0x20fc61;
    ParamDict::set(&pd_5,0xd,1);
    uStack_f0 = 0x20fc70;
    ParamDict::set(&pd_5,4,0);
    uStack_f0 = 0x20fc7f;
    ParamDict::set(&pd_5,0xe,0);
    uStack_f0 = 0x20fc9a;
    ParamDict::set(&pd_5,5,*(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x18 +
                                   (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x20fcb5;
    ParamDict::set(&pd_5,6,*(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x1c +
                                   (long)&(this->weight_winograd43_data).data));
    uStack_f0 = 0x20fcc5;
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var3 = this->_vptr_Convolution_x86_fma;
    if (*(int *)(pp_Var3[-3] + 0x18 + (long)&(this->weight_winograd43_data).data) == 0) {
      local_98 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_c4 = 0;
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      uStack_a8 = SUB128(ZEXT812(0),4);
      aiStack_a0[0] = 0;
      p_Var2 = pp_Var3[-3];
      iStack_ac = pd.d._4_4_;
      if (&pd != (ParamDict *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data)) {
        piVar4 = *(int **)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data);
        pd.d._0_4_ = (undefined4)
                     *(undefined8 *)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
        pd.d._4_4_ = (int)((ulong)*(undefined8 *)
                                   (p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data) >>
                          0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             (p_Var2 + 0x40 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var2);
        local_b8 = *(Allocator **)(p_Var2 + (long)&(this->scale_in_data).data);
        uStack_a8 = *(undefined8 *)(p_Var2 + 0x10 + (long)&(this->scale_in_data).data);
        iStack_b0 = (int)*(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data);
        iStack_ac = (int)((ulong)*(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data) >>
                         0x20);
        aiStack_a0[0] = *(int *)(p_Var2 + 0x18 + (long)&(this->scale_in_data).data);
        local_98 = *(size_t *)(p_Var2 + 0x20 + (long)&(this->scale_in_data).data);
      }
      pLVar13 = this->convolution_dilation1;
      uStack_f0 = 0x211250;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      uStack_f0 = 0x211261;
      (*pLVar13->_vptr_Layer[3])(pLVar13,&local_40);
      uStack_f0 = 0x21126e;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              uStack_f0 = 0x2112b0;
              free(pd._vptr_ParamDict);
            }
          }
          else {
            uStack_f0 = 0x21129a;
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar15 = 0x40;
      auVar23._0_12_ = ZEXT812(0);
      auVar23._12_4_ = 0;
      do {
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar15) = 0;
        *(undefined1 (*) [16])(auStackY_118 + lVar15) = auVar23;
        *(undefined1 (*) [16])(auStackY_10c + lVar15) = auVar23;
        *(undefined1 (*) [16])(&stack0xffffffffffffff08 + lVar15) = auVar23;
        *(undefined1 (*) [16])(auStack_ec + lVar15) = auVar23;
        lVar15 = lVar15 + 0x48;
      } while (lVar15 != 0xd0);
      p_Var2 = pp_Var3[-3];
      if (&pd != (ParamDict *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data)) {
        piVar4 = *(int **)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                uStack_f0 = 0x210eed;
                free(pd._vptr_ParamDict);
              }
            }
            else {
              uStack_f0 = 0x20fd6f;
              (*local_b8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict =
             *(_func_int ***)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data);
        pd.d._0_4_ = (undefined4)
                     *(undefined8 *)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
        pd.d._4_4_ = (int)((ulong)*(undefined8 *)
                                   (p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data) >>
                          0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             (p_Var2 + 0x40 + (long)&(this->weight_winograd63_data).data) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var2);
        local_b8 = *(Allocator **)(p_Var2 + (long)&(this->scale_in_data).data);
        uStack_a8 = *(undefined8 *)(p_Var2 + 0x10 + (long)&(this->scale_in_data).data);
        iStack_b0 = (int)*(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data);
        iStack_ac = (int)((ulong)*(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data) >>
                         0x20);
        aiStack_a0[0] = *(int *)(p_Var2 + 0x18 + (long)&(this->scale_in_data).data);
        local_98 = *(size_t *)(p_Var2 + 0x20 + (long)&(this->scale_in_data).data);
      }
      p_Var2 = this->_vptr_Convolution_x86_fma[-3];
      if (&local_90 != (void **)(p_Var2 + 0x28 + (long)&(this->scale_in_data).data)) {
        piVar4 = *(int **)(p_Var2 + 0x30 + (long)&(this->scale_in_data).data);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_84,uStack_88);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_70 == (long *)0x0) {
              if (local_90 != (void *)0x0) {
                uStack_f0 = 0x210fd0;
                free(local_90);
              }
            }
            else {
              uStack_f0 = 0x210fc1;
              (**(code **)(*local_70 + 0x18))();
            }
          }
        }
        local_90 = *(void **)(p_Var2 + 0x28 + (long)&(this->scale_in_data).data);
        uStack_88 = (undefined4)*(undefined8 *)(p_Var2 + 0x30 + (long)&(this->scale_in_data).data);
        uStack_84 = (undefined4)
                    ((ulong)*(undefined8 *)(p_Var2 + 0x30 + (long)&(this->scale_in_data).data) >>
                    0x20);
        uStack_80 = (undefined4)*(undefined8 *)(p_Var2 + 0x38 + (long)&(this->scale_in_data).data);
        uStack_7c = (undefined4)
                    ((ulong)*(undefined8 *)(p_Var2 + 0x38 + (long)&(this->scale_in_data).data) >>
                    0x20);
        uStack_78 = *(undefined4 *)(p_Var2 + 0x40 + (long)&(this->scale_in_data).data);
        local_70 = *(long **)(&this->field_0x1c8 + (long)p_Var2);
        local_68 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var2);
        uStack_60 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var2);
        local_58 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var2);
        local_50 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var2);
      }
      pLVar13 = this->convolution_dilation1;
      uStack_f0 = 0x21107b;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      uStack_f0 = 0x21108c;
      (*pLVar13->_vptr_Layer[3])(pLVar13,&local_40);
      uStack_f0 = 0x211099;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      lVar15 = 0x48;
      do {
        piVar4 = *(int **)((long)&pd.d + lVar15);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar15);
            if (*(long **)((long)&local_b8 + lVar15) == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                uStack_f0 = 0x2110da;
                free(pvVar6);
              }
            }
            else {
              uStack_f0 = 0x2110c7;
              (**(code **)(**(long **)((long)&local_b8 + lVar15) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_98 + lVar15) = 0;
        *(undefined8 *)((long)&pd.d + lVar15 + 4) = 0;
        *(undefined8 *)((long)&uStack_c4 + lVar15) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar15) = 0;
        *(undefined8 *)((long)&pd.d + lVar15) = 0;
        *(undefined8 *)((long)&iStack_b0 + lVar15) = 0;
        *(undefined8 *)((long)aiStack_a0 + lVar15 + -8) = 0;
        *(undefined4 *)((long)aiStack_a0 + lVar15) = 0;
        lVar15 = lVar15 + -0x48;
      } while (lVar15 != -0x48);
    }
    uStack_f0 = 0x21111d;
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var2 = this->_vptr_Convolution_x86_fma[-3];
      piVar4 = *(int **)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (*(long **)(p_Var2 + (long)&(this->scale_in_data).data) == (long *)0x0) {
            if (*(void **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data) !=
                (void *)0x0) {
              uStack_f0 = 0x211168;
              free(*(void **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data));
            }
          }
          else {
            uStack_f0 = 0x211159;
            (**(code **)(**(long **)(p_Var2 + (long)&(this->scale_in_data).data) + 0x18))();
          }
        }
      }
      *(undefined8 *)(p_Var2 + 0x20 + (long)&(this->scale_in_data).data) = 0;
      *(undefined8 *)(p_Var2 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var2 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
      *(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data) = 0;
      *(undefined8 *)(p_Var2 + 0x10 + (long)&(this->scale_in_data).data) = 0;
      *(undefined4 *)(p_Var2 + 0x18 + (long)&(this->scale_in_data).data) = 0;
    }
    uStack_f0 = 0x2111a6;
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  cVar22 = '\x01';
  cVar21 = '\x01';
  if (opt->use_packing_layout != false) {
    cVar22 = ((uVar8 & 3) == 0) * '\x03' + '\x01';
    if ((uVar8 & 7) == 0) {
      cVar22 = '\b';
    }
    cVar21 = ((uVar18 & 3) == 0) * '\x03' + '\x01';
    if ((uVar18 & 7) == 0) {
      cVar21 = '\b';
    }
  }
  inch = (int)uVar8;
  if ((cVar22 == '\b') && (cVar21 == '\b')) {
    if ((((kernel_w ^ 1) == 0 && (kernel_h ^ 1) == 0) &&
        ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
       ((((uVar12 = kernel_w ^ 1 | kernel_h ^ 1, uVar12 == 0 &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
        ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      kernel_w = 1;
      kernel_h = 1;
LAB_0020ff78:
      uStack_f0 = 0x20ff7d;
      convolution_im2col_sgemm_transform_kernel_pack8_avx
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,uVar18,kernel_w,kernel_h);
    }
    else {
      if (opt->use_winograd_convolution == true) {
        bVar7 = opt->use_winograd23_convolution;
        uVar9 = (undefined3)(uVar12 >> 8);
        if ((bVar7 == false) && (opt->use_winograd43_convolution == false)) {
          if (((kernel_h == 3) && (kernel_w == 3)) && (opt->use_winograd63_convolution != false)) {
LAB_0020fe86:
            if ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
                 (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) &&
               ((8 < (int)uVar18 || (8 < inch)))) {
              if ((opt->use_winograd63_convolution != true) ||
                 (((inch < 0x10 || (0x30 < uVar18 - 0x10)) || (0x40 < inch)))) {
                bVar16 = bVar7 | opt->use_winograd43_convolution;
                kernel_w = CONCAT31(uVar9,bVar16);
                if (bVar16 != 0) {
                  pOVar19 = (Option *)(ulong)CONCAT31(uVar9,0xf < inch);
                  if (((bVar7 | opt->use_winograd63_convolution) == 1) &&
                     ((0xf < (int)uVar18 & opt->use_winograd43_convolution & 0xf < inch) == 0)) {
                    uStack_f0 = 0x210e79;
                    conv3x3s1_winograd23_transform_kernel_pack8_avx
                              ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                               &this->weight_winograd23_data,inch,uVar18,pOVar19);
                  }
                  else {
                    uStack_f0 = 0x2112eb;
                    conv3x3s1_winograd43_transform_kernel_pack8_avx
                              ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                               &this->weight_winograd43_data,inch,uVar18,pOVar19);
                  }
                  goto LAB_0020ff95;
                }
              }
              uStack_f0 = 0x210eb3;
              conv3x3s1_winograd63_transform_kernel_pack8_avx
                        ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                         &this->weight_winograd63_data,inch,uVar18,(Option *)(ulong)kernel_w);
              goto LAB_0020ff95;
            }
          }
        }
        else if (kernel_h == 3 && kernel_w == 3) goto LAB_0020fe86;
      }
      if (((kernel_h == 3 && kernel_w == 3) &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
        kernel_w = 3;
        kernel_h = 3;
      }
      else if ((kernel_h == 2 && kernel_w == 2) &&
              ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) {
        kernel_w = 2;
        kernel_h = 2;
      }
      else if (opt->use_sgemm_convolution == true) goto LAB_0020ff78;
      uStack_f0 = 8;
      uStackY_100 = 0x20ff91;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,uVar18,kernel_w,kernel_h,8,8);
    }
  }
LAB_0020ff95:
  if ((cVar22 == '\x04') && (cVar21 == '\b')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    iVar17 = *(int *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((iVar17 == 1) &&
       ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) ||
        ((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar17 = 1;
      iVar20 = 1;
    }
    else {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar20 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if (opt->use_sgemm_convolution != true) {
        uStack_f0 = 8;
        uStackY_100 = 0x210084;
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                   &this->weight_data_tm,inch,iVar14,iVar17,iVar20,4,8);
        goto LAB_00210088;
      }
    }
    uStack_f0 = 0x210070;
    convolution_im2col_sgemm_transform_kernel_pack4to8_avx
              ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,inch,iVar14,iVar17,iVar20);
  }
LAB_00210088:
  if ((cVar22 == '\x01') && (cVar21 == '\b')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    iVar17 = *(int *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((iVar17 == 1) &&
       ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) ||
        (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)))) &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar17 = 1;
      iVar20 = 1;
LAB_002101ec:
      uStack_f0 = 0x2101f1;
      convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar14,iVar17,iVar20);
    }
    else {
      if ((iVar17 == 3) &&
         ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
            (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
            ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) ||
          ((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
           ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar17 = 3;
        iVar20 = 3;
      }
      else {
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar20 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution == true) goto LAB_002101ec;
      }
      uStack_f0 = 8;
      uStackY_100 = 0x210205;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar14,iVar17,iVar20,1,8);
    }
  }
  if ((cVar22 == '\b') && (cVar21 == '\x04')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    iVar17 = *(int *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((iVar17 == 1) &&
       ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) ||
        (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)))) &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar17 = 1;
      iVar20 = 1;
    }
    else {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar20 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if (opt->use_sgemm_convolution != true) {
        uStack_f0 = 4;
        uStackY_100 = 0x2102f8;
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                   &this->weight_data_tm,inch,iVar14,iVar17,iVar20,8,4);
        goto LAB_002102fc;
      }
    }
    uStack_f0 = 0x2102e4;
    convolution_im2col_sgemm_transform_kernel_pack8to4_avx
              ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,inch,iVar14,iVar17,iVar20);
  }
LAB_002102fc:
  if ((cVar22 == '\b') && (cVar21 == '\x01')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    uVar18 = *(uint *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((uVar18 == 1) &&
       ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))) ||
        ((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      uVar18 = 1;
      iVar17 = 1;
LAB_0021043f:
      uStack_f0 = 0x210444;
      convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar14,uVar18,iVar17);
    }
    else {
      if (((uVar18 == 3) &&
          (*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3)) &&
         (((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) {
        if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
          uStack_f0 = 0x210419;
          conv3x3s1_winograd63_transform_kernel_pack8to1_avx
                    ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_winograd63_data,inch,
                     *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                     (Option *)(ulong)uVar18);
          goto LAB_0021045c;
        }
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar17 = 3;
      }
      else {
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar17 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution == true) goto LAB_0021043f;
      }
      uStack_f0 = 1;
      uStackY_100 = 0x210458;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar14,uVar18,iVar17,8,1);
    }
  }
LAB_0021045c:
  if ((cVar22 == '\x04') && (cVar21 == '\x04')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    uVar18 = *(uint *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    pOVar19 = (Option *)(ulong)uVar18;
    if ((uVar18 == 1) &&
       (((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
          ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
         ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      uVar18 = 1;
      iVar14 = 1;
    }
    else {
      if (opt->use_winograd_convolution == true) {
        bVar7 = opt->use_winograd23_convolution;
        if ((bVar7 == false) && (opt->use_winograd43_convolution == false)) {
          if ((uVar18 == 3) && (opt->use_winograd63_convolution != false)) {
LAB_0021054b:
            if (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3) &&
                (((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
               (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)) {
              bVar1 = opt->use_winograd63_convolution;
              if ((((bVar1 == true) && (7 < inch)) &&
                  ((*(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data) - 8U < 0x19
                   && (inch < 0x21)))) ||
                 (bVar7 == false && opt->use_winograd43_convolution == false)) {
                uStack_f0 = 0x210e99;
                conv3x3s1_winograd63_transform_kernel_pack4_sse
                          ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                           &this->weight_winograd63_data,inch,
                           *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                           pOVar19);
                goto LAB_002106d4;
              }
              if ((opt->use_winograd43_convolution == false) || (inch < 8)) {
                if (bVar7 == false && bVar1 == false) goto LAB_002112bd;
              }
              else if (((bVar7 | bVar1) != 1) ||
                      (7 < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))) {
LAB_002112bd:
                uStack_f0 = 0x2112d8;
                conv3x3s1_winograd43_transform_kernel_pack4_sse
                          ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                           &this->weight_winograd43_data,inch,
                           *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                           pOVar19);
                goto LAB_002106d4;
              }
              uStack_f0 = 0x2105ff;
              conv3x3s1_winograd23_transform_kernel_pack4_sse
                        ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                         &this->weight_winograd23_data,inch,
                         *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                         pOVar19);
              goto LAB_002106d4;
            }
          }
        }
        else if (uVar18 == 3) goto LAB_0021054b;
      }
      if ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
         (((((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)) &&
           ((0xb < inch ||
            (0xb < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))) ||
          (((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
            ((1 < *(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) ||
             (1 < *(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data))))) &&
           ((0xf < inch ||
            (0xf < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))))))) {
LAB_0021067b:
        bVar7 = false;
      }
      else if ((1 < *(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
              (bVar7 = true,
              1 < *(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data))) {
        if (0xf < inch) goto LAB_0021067b;
        bVar7 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10;
      }
      iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar14 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if ((opt->use_sgemm_convolution != true) || (bVar7)) {
        uStack_f0 = 4;
        uStackY_100 = 0x2106d0;
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                   &this->weight_data_tm,inch,iVar17,uVar18,iVar14,4,4);
        goto LAB_002106d4;
      }
    }
    uStack_f0 = 0x2106b6;
    convolution_im2col_sgemm_transform_kernel_pack4_sse
              ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,inch,iVar17,uVar18,iVar14);
  }
LAB_002106d4:
  if ((cVar22 == '\x01') && (cVar21 == '\x04')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    iVar17 = *(int *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((iVar17 == 1) &&
       (((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
          (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar17 = 1;
      iVar20 = 1;
LAB_002108c4:
      uStack_f0 = 0x2108c9;
      convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar14,iVar17,iVar20);
    }
    else {
      if ((iVar17 == 3) &&
         (((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
             (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
          (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
            ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar17 = 3;
        iVar20 = 3;
      }
      else {
        if ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
           (((((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)) &&
             ((0xb < inch ||
              (0xb < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))) ||
            (((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
              ((1 < *(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) ||
               (1 < *(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data))))) &&
             ((0xf < inch ||
              (0xf < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))))))) {
LAB_0021088e:
          bVar7 = false;
        }
        else if ((1 < *(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
                (bVar7 = true,
                1 < *(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data))) {
          if (0xf < inch) goto LAB_0021088e;
          bVar7 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10;
        }
        iVar14 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar20 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if ((opt->use_sgemm_convolution == true) && (!bVar7)) goto LAB_002108c4;
      }
      uStack_f0 = 4;
      uStackY_100 = 0x2108dd;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar14,iVar17,iVar20,1,4);
    }
  }
  if ((cVar22 == '\x04') && (cVar21 == '\x01')) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    uVar18 = *(uint *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if ((uVar18 == 1) &&
       (((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
          (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      uVar18 = 1;
      iVar14 = 1;
LAB_00210aa4:
      uStack_f0 = 0x210aa9;
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,inch,iVar17,uVar18,iVar14);
    }
    else if ((((opt->use_winograd_convolution == true) && (uVar18 == 3)) &&
             (opt->use_winograd63_convolution != false)) &&
            (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
              ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))))))) {
      uStack_f0 = 0x2109f2;
      conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd63_data,inch,
                 *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                 (Option *)(ulong)uVar18);
    }
    else {
      if ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1) &&
         (((((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)) &&
           ((0xb < inch ||
            (0xb < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))) ||
          (((*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
            ((1 < *(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) ||
             (1 < *(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data))))) &&
           ((0xf < inch ||
            (0xf < *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data))))))))) {
LAB_00210a6e:
        bVar7 = false;
      }
      else if ((1 < *(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data)) ||
              (bVar7 = true,
              1 < *(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data))) {
        if (0xf < inch) goto LAB_00210a6e;
        bVar7 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10;
      }
      iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar14 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
      if ((opt->use_sgemm_convolution == true) && (!bVar7)) goto LAB_00210aa4;
      uStack_f0 = 1;
      uStackY_100 = 0x210abd;
      convolution_transform_kernel_packed_sse
                ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,inch,iVar17,uVar18,iVar14,4,1);
    }
  }
  if ((cVar22 != '\x01') || (cVar21 != '\x01')) goto LAB_00210cfb;
  p_Var2 = this->_vptr_Convolution_x86_fma[-3];
  uVar18 = *(uint *)(p_Var2 + 0x34 + (long)&(this->weight_winograd23_data).data);
  if ((uVar18 == 1) &&
     (((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
         (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
        (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
        (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
      (((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
        ((*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
         (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
       ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
        (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
    iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
    uVar18 = 1;
    iVar14 = 1;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar16 = opt->use_winograd23_convolution;
      if ((bool)bVar16 == false) {
        if ((uVar18 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_00210ba1;
      }
      else if (uVar18 == 3) {
LAB_00210ba1:
        if ((((*(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3) &&
             (*(int *)(p_Var2 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var2 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var2 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var2 + (long)&(this->weight_winograd43_data).data) == 1)))) {
          if ((opt->use_winograd43_convolution == true) && (0xf < inch)) {
            bVar16 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data) < 0x10 &
                     bVar16;
          }
          if (bVar16 == 0) {
            uStack_f0 = 0x210c0f;
            conv3x3s1_winograd43_transform_kernel_sse
                      ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                       &this->weight_winograd43_data,inch,
                       *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                       (Option *)(ulong)uVar18);
          }
          else {
            uStack_f0 = 0x210edb;
            conv3x3s1_winograd23_transform_kernel_sse
                      ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
                       &this->weight_winograd23_data,inch,
                       *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data),
                       (Option *)(ulong)uVar18);
          }
          goto LAB_00210cfb;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var2 != (_func_int *)0xfffffffffffffeb0) {
        piVar4 = *(int **)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->weight_data_tm).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = (this->weight_data_tm).data;
            pAVar5 = (this->weight_data_tm).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                uStack_f0 = 0x210c94;
                free(pvVar6);
              }
            }
            else {
              uStack_f0 = 0x210c85;
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar4 = *(int **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
        (this->weight_data_tm).data =
             *(void **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).refcount = piVar4;
        (this->weight_data_tm).elemsize =
             *(size_t *)(p_Var2 + 0x40 + (long)&(this->weight_winograd63_data).data);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var2);
        (this->weight_data_tm).allocator =
             *(Allocator **)(p_Var2 + (long)&(this->scale_in_data).data);
        uVar10 = *(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data);
        uVar11 = *(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data + 8);
        (this->weight_data_tm).dims = (int)uVar10;
        (this->weight_data_tm).w = (int)((ulong)uVar10 >> 0x20);
        (this->weight_data_tm).h = (int)uVar11;
        (this->weight_data_tm).d = (int)((ulong)uVar11 >> 0x20);
        (this->weight_data_tm).c = *(int *)(p_Var2 + 0x18 + (long)&(this->scale_in_data).data);
        (this->weight_data_tm).cstep =
             *(size_t *)(p_Var2 + 0x20 + (long)&(this->scale_in_data).data);
      }
      goto LAB_00210cfb;
    }
    iVar17 = *(int *)(p_Var2 + 0x30 + (long)&(this->weight_winograd23_data).data);
    iVar14 = *(int *)(p_Var2 + 0x38 + (long)&(this->weight_winograd23_data).data);
  }
  uStack_f0 = 0x210c3d;
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data),
             &this->weight_sgemm_data,inch,iVar17,uVar18,iVar14);
LAB_00210cfb:
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_Convolution_x86_fma[-3];
    piVar4 = *(int **)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(p_Var2 + (long)&(this->scale_in_data).data) == (long *)0x0) {
          if (*(void **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data) != (void *)0x0)
          {
            uStack_f0 = 0x210d50;
            free(*(void **)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data));
          }
        }
        else {
          uStack_f0 = 0x210d41;
          (**(code **)(**(long **)(p_Var2 + (long)&(this->scale_in_data).data) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var2 + 0x20 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var2 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var2 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var2 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var2 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var2 + 8 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var2 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var2 + 0x18 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}